

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

int XNVCTRLQueryValidTargetAttributeValues
              (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,
              NVCTRLAttributeValidValuesRec *values)

{
  int iVar1;
  XExtDisplayInfo *pXVar2;
  undefined1 *puVar3;
  undefined4 in_ECX;
  undefined2 in_DX;
  undefined2 in_SI;
  long in_RDI;
  undefined4 in_R8D;
  int *in_R9;
  int exists;
  xnvCtrlQueryValidAttributeValuesReq *req;
  xnvCtrlQueryValidAttributeValuesReply rep;
  XExtDisplayInfo *info;
  Display *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_38;
  int local_34;
  int local_4;
  
  pXVar2 = find_display(in_stack_ffffffffffffff98);
  if (in_R9 == (int *)0x0) {
    local_4 = 0;
  }
  else if ((pXVar2 == (XExtDisplayInfo *)0x0) || (pXVar2->codes == (XExtCodes *)0x0)) {
    local_4 = 0;
  }
  else if ((pXVar2 == (XExtDisplayInfo *)0x0) || (pXVar2->codes == (XExtCodes *)0x0)) {
    XMissingExtension(in_RDI,nvctrl_extension_name);
    local_4 = 0;
  }
  else {
    XNVCTRLCheckTargetData
              ((Display *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (XExtDisplayInfo *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (*(long *)(in_RDI + 0x968) != 0) {
      (*(code *)**(undefined8 **)(in_RDI + 0x968))(in_RDI);
    }
    puVar3 = (undefined1 *)_XGetRequest(in_RDI,5,0x10);
    *puVar3 = (char)pXVar2->codes->major_opcode;
    puVar3[1] = 5;
    *(undefined2 *)(puVar3 + 6) = in_SI;
    *(undefined2 *)(puVar3 + 4) = in_DX;
    *(undefined4 *)(puVar3 + 8) = in_ECX;
    *(undefined4 *)(puVar3 + 0xc) = in_R8D;
    iVar1 = _XReply(in_RDI,&stack0xffffffffffffffb0,0,1);
    if (iVar1 == 0) {
      if (*(long *)(in_RDI + 0x968) != 0) {
        (**(code **)(*(long *)(in_RDI + 0x968) + 8))(in_RDI);
      }
      if (*(long *)(in_RDI + 0xd0) != 0) {
        (**(code **)(in_RDI + 0xd0))(in_RDI);
      }
      local_4 = 0;
    }
    else {
      *in_R9 = in_stack_ffffffffffffffbc;
      if (in_stack_ffffffffffffffbc == 4) {
        in_R9[1] = in_stack_ffffffffffffffc0;
        in_R9[2] = in_stack_ffffffffffffffc4;
      }
      if (in_stack_ffffffffffffffbc == 5) {
        in_R9[1] = local_38;
      }
      in_R9[3] = local_34;
      if (*(long *)(in_RDI + 0x968) != 0) {
        (**(code **)(*(long *)(in_RDI + 0x968) + 8))(in_RDI);
      }
      local_4 = in_stack_ffffffffffffffb8;
      if (*(long *)(in_RDI + 0xd0) != 0) {
        (**(code **)(in_RDI + 0xd0))(in_RDI);
      }
    }
  }
  return local_4;
}

Assistant:

Bool XNVCTRLQueryValidTargetAttributeValues (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,                                 
    NVCTRLAttributeValidValuesRec *values
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlQueryValidAttributeValuesReply rep;
    xnvCtrlQueryValidAttributeValuesReq   *req;
    Bool exists;
    
    if (!values) return False;

    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);
    XNVCTRLCheckTargetData(dpy, info, &target_type, &target_id);

    LockDisplay (dpy);
    GetReq (nvCtrlQueryValidAttributeValues, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlQueryValidAttributeValues;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    if (!_XReply (dpy, (xReply *) &rep, 0, xTrue)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    exists = rep.flags;
    values->type = rep.attr_type;
    if (rep.attr_type == ATTRIBUTE_TYPE_RANGE) {
        values->u.range.min = rep.min;
        values->u.range.max = rep.max;
    }
    if (rep.attr_type == ATTRIBUTE_TYPE_INT_BITS) {
        values->u.bits.ints = rep.bits;
    }
    values->permissions = rep.perms;
    UnlockDisplay (dpy);
    SyncHandle ();
    return exists;
}